

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_set_xo_var(secp256k1_ge *r,secp256k1_fe *x,int odd)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  secp256k1_fe x3;
  secp256k1_fe x2;
  
  (r->x).n[4] = x->n[4];
  uVar1 = x->n[0];
  uVar2 = x->n[1];
  uVar3 = x->n[3];
  (r->x).n[2] = x->n[2];
  (r->x).n[3] = uVar3;
  (r->x).n[0] = uVar1;
  (r->x).n[1] = uVar2;
  secp256k1_fe_impl_sqr(&x2,x);
  secp256k1_fe_impl_mul(&x3,x,&x2);
  r->infinity = 0;
  x3.n[0] = x3.n[0] + 7;
  r_00 = &r->y;
  iVar4 = secp256k1_fe_sqrt(r_00,&x3);
  secp256k1_fe_impl_normalize_var(r_00);
  if (((uint)(r->y).n[0] & 1) != odd) {
    secp256k1_fe_impl_negate_unchecked(r_00,r_00,1);
  }
  return iVar4;
}

Assistant:

static int secp256k1_ge_set_xo_var(secp256k1_ge *r, const secp256k1_fe *x, int odd) {
    secp256k1_fe x2, x3;
    int ret;
    SECP256K1_FE_VERIFY(x);

    r->x = *x;
    secp256k1_fe_sqr(&x2, x);
    secp256k1_fe_mul(&x3, x, &x2);
    r->infinity = 0;
    secp256k1_fe_add_int(&x3, SECP256K1_B);
    ret = secp256k1_fe_sqrt(&r->y, &x3);
    secp256k1_fe_normalize_var(&r->y);
    if (secp256k1_fe_is_odd(&r->y) != odd) {
        secp256k1_fe_negate(&r->y, &r->y, 1);
    }

    SECP256K1_GE_VERIFY(r);
    return ret;
}